

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPG.h
# Opt level: O1

void __thiscall JPG::~JPG(JPG *this)

{
  if (this->data != (MCU *)0x0) {
    operator_delete__(this->data);
  }
  if (this->blocks != (Block *)0x0) {
    operator_delete__(this->blocks);
  }
  if (this->BMPData != (YCbCr *)0x0) {
    operator_delete__(this->BMPData);
    return;
  }
  return;
}

Assistant:

~JPG() {
        delete[] data;
        delete[] blocks;
        delete[] BMPData;
    }